

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

void coll_tmap_clear(coll_tmap_t *map)

{
  coll_tmap_entry_t *pcVar1;
  coll_tmap_entry_t *pcVar2;
  coll_tmap_entry_t *data;
  bool bVar3;
  coll_seq_t seq;
  coll_seq_t cStack_28;
  
  coll_seq_init(&cStack_28);
  pcVar1 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
LAB_00106124:
    coll_seq_foreach(&cStack_28,free);
    coll_seq_free(&cStack_28);
    map->root = (coll_tmap_entry_t *)0x0;
    map->size = 0;
    return;
  }
  do {
    data = pcVar1;
    pcVar1 = data->right;
  } while (data->right != (coll_tmap_entry_t *)0x0);
  do {
    while( true ) {
      coll_seq_prepend(&cStack_28,data);
      pcVar1 = data->left;
      pcVar2 = data;
      if (data->left == (coll_tmap_entry_t *)0x0) break;
      do {
        data = pcVar1;
        pcVar1 = data->right;
      } while (data->right != (coll_tmap_entry_t *)0x0);
    }
    do {
      data = pcVar2->parent;
      if (data == (coll_tmap_entry_t *)0x0) goto LAB_00106124;
      bVar3 = data->left == pcVar2;
      pcVar2 = data;
    } while (bVar3);
  } while( true );
}

Assistant:

void coll_tmap_clear(coll_tmap_t *map) {
    coll_seq_t seq;
    coll_seq_init(&seq);
    entry_t *cur = entry_last(map->root);
    while (cur) {
        coll_seq_prepend(&seq, cur);
        cur = entry_prev(cur);
    }
    coll_seq_foreach(&seq, free);
    coll_seq_free(&seq);
    map->root = NULL;
    map->size = 0;
}